

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

ON__UINT32 Internal_DoubleArrayDataCRC(ON__UINT32 current_remainder,size_t count,double *a)

{
  double *pdVar1;
  undefined1 uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  double dVar7;
  endian eVar8;
  undefined8 *puVar9;
  double x;
  undefined8 local_40;
  double local_38;
  
  eVar8 = ON::Endian();
  puVar9 = &local_40;
  if (eVar8 != big_endian) {
    puVar9 = (undefined8 *)0x0;
  }
  if ((a != (double *)0x0) && (0 < (long)count)) {
    pdVar1 = a + count;
    local_38 = ON_DBL_QNAN;
    do {
      local_40 = *a;
      if ((local_40 != 0.0) || (NAN(local_40))) {
        if (NAN(local_40)) {
          local_40 = local_38;
        }
      }
      else {
        local_40 = 0.0;
      }
      if (eVar8 == big_endian) {
        uVar2 = *(undefined1 *)puVar9;
        *(undefined1 *)puVar9 = local_40._7_1_;
        dVar7 = local_40;
        uVar3 = local_40._1_2_ << 8;
        uVar5 = local_40._1_2_ >> 8;
        local_40._3_2_ = SUB82(dVar7,3);
        uVar4 = local_40._3_2_ << 8;
        uVar6 = local_40._3_2_ >> 8;
        local_40 = (double)CONCAT35(CONCAT12(uVar2,uVar3 | uVar5),
                                    CONCAT23(uVar4 | uVar6,
                                             CONCAT21(local_40._5_2_ << 8 | local_40._5_2_ >> 8,
                                                      (undefined1)local_40)));
      }
      a = a + 1;
      current_remainder = ON_CRC32(current_remainder,8,&local_40);
    } while (a < pdVar1);
  }
  return current_remainder;
}

Assistant:

static ON__UINT32 Internal_DoubleArrayDataCRC(
  ON__UINT32 current_remainder,
  size_t count,
  const double* a
)
{
  double x;
  char* byte_swap 
    = (ON::endian::big_endian == ON::Endian()) 
    ? ((char*)&x)
    : nullptr;
  char c;
  if (nullptr != a && count > 0)
  {
    const double* a1 = a + count;
    while (a < a1)
    {
      x = *a++;
      if (0.0 == x)
        x = 0.0; // change -0.0 into +0.0
      else if (false == (x == x))
        x = ON_DBL_QNAN; // change any nan into ON_DBL_QNAN.
      if (nullptr != byte_swap)
      {
        c = byte_swap[0]; byte_swap[0] = byte_swap[7]; byte_swap[7] = c;
        c = byte_swap[1]; byte_swap[1] = byte_swap[6]; byte_swap[6] = c;
        c = byte_swap[2]; byte_swap[2] = byte_swap[5]; byte_swap[5] = c;
        c = byte_swap[3]; byte_swap[3] = byte_swap[4]; byte_swap[4] = c;
      }
      current_remainder = ON_CRC32(current_remainder, sizeof(x), (const void*)&x);
    }
  }
  return current_remainder;
}